

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::analysis::TypeManager::FindPointerToType
          (TypeManager *this,uint32_t type_id,StorageClass storage_class)

{
  uint32_t uVar1;
  StorageClass SVar2;
  Type *type;
  Module *pMVar3;
  Instruction *pIVar4;
  TypeManager *this_00;
  IRContext *pIVar5;
  long lVar6;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_140;
  uint32_t local_138;
  StorageClass local_134;
  Pointer pointerTy;
  undefined1 local_f8 [48];
  undefined4 local_c8;
  SmallVector<unsigned_int,_2UL> local_c0;
  SmallVector<unsigned_int,_2UL> local_98;
  SmallVector<unsigned_int,_2UL> local_70;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  type = GetType(this,type_id);
  Pointer::Pointer(&pointerTy,type,storage_class);
  pIVar5 = this->context_;
  pMVar3 = (pIVar5->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  pIVar4 = &(pMVar3->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  do {
    pIVar4 = *(Instruction **)((long)pIVar4 + 8);
    if (pIVar4 == &(pMVar3->types_values_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_
       ) {
      uVar1 = IRContext::TakeNextId(pIVar5);
      if (uVar1 == 0) {
        uVar1 = 0;
      }
      else {
        pIVar4 = (Instruction *)::operator_new(0x70);
        pIVar5 = this->context_;
        init_list._M_len = 1;
        init_list._M_array = &local_134;
        local_134 = storage_class;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_70,init_list);
        local_f8._0_4_ = 0x11;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)(local_f8 + 8),&local_70);
        init_list_00._M_len = 1;
        init_list_00._M_array = &local_138;
        local_138 = type_id;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_98,init_list_00);
        local_c8 = 1;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c0,&local_98);
        local_48 = 0;
        uStack_40 = 0;
        local_38 = 0;
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        _M_range_initialize<spvtools::opt::Operand_const*>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                   &local_48,local_f8,&local_98);
        Instruction::Instruction(pIVar4,pIVar5,OpTypePointer,0,uVar1,(OperandList *)&local_48);
        local_140._M_head_impl = pIVar4;
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &local_48);
        lVar6 = 0x38;
        do {
          utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                    ((SmallVector<unsigned_int,_2UL> *)(local_f8 + lVar6));
          lVar6 = lVar6 + -0x30;
        } while (lVar6 != -0x28);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_98);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_70);
        IRContext::AddType(this->context_,
                           (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                            *)&local_140);
        this_00 = IRContext::get_type_mgr(this->context_);
        RegisterType(this_00,uVar1,&pointerTy.super_Type);
        if (local_140._M_head_impl != (Instruction *)0x0) {
          (*((local_140._M_head_impl)->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
            _vptr_IntrusiveNodeBase[1])();
        }
      }
LAB_0046cbd6:
      analysis::Type::~Type(&pointerTy.super_Type);
      return uVar1;
    }
    if (pIVar4->opcode_ == OpTypePointer) {
      uVar1 = Instruction::GetSingleWordOperand(pIVar4,2);
      if (uVar1 == type_id) {
        SVar2 = Instruction::GetSingleWordOperand(pIVar4,1);
        if (SVar2 == storage_class) {
          uVar1 = Instruction::result_id(pIVar4);
          goto LAB_0046cbd6;
        }
      }
    }
    pIVar5 = this->context_;
    pMVar3 = (pIVar5->module_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
             .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  } while( true );
}

Assistant:

uint32_t TypeManager::FindPointerToType(uint32_t type_id,
                                        spv::StorageClass storage_class) {
  Type* pointeeTy = GetType(type_id);
  Pointer pointerTy(pointeeTy, storage_class);

  Module::inst_iterator type_itr = context()->module()->types_values_begin();
  for (; type_itr != context()->module()->types_values_end(); ++type_itr) {
    const Instruction* type_inst = &*type_itr;
    if (type_inst->opcode() == spv::Op::OpTypePointer &&
        type_inst->GetSingleWordOperand(kSpvTypePointerTypeIdInIdx) ==
            type_id &&
        spv::StorageClass(type_inst->GetSingleWordOperand(
            kSpvTypePointerStorageClass)) == storage_class)
      return type_inst->result_id();
  }

  // Must create the pointer type.
  uint32_t resultId = context()->TakeNextId();
  if (resultId == 0) {
    return 0;
  }
  std::unique_ptr<Instruction> type_inst(
      new Instruction(context(), spv::Op::OpTypePointer, 0, resultId,
                      {{spv_operand_type_t::SPV_OPERAND_TYPE_STORAGE_CLASS,
                        {uint32_t(storage_class)}},
                       {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {type_id}}}));
  context()->AddType(std::move(type_inst));
  context()->get_type_mgr()->RegisterType(resultId, pointerTy);
  return resultId;
}